

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O1

uint64_t SSL_get_read_sequence(SSL *ssl)

{
  ulong uVar1;
  
  if (ssl->method->is_dtls == false) {
    return ssl->s3->read_sequence;
  }
  uVar1 = (ssl->d1->read_epoch).bitmap.max_seq_num_;
  if (uVar1 >> 0x30 == 0) {
    return (ulong)*(uint *)&ssl->d1->read_epoch << 0x30 | uVar1;
  }
  abort();
}

Assistant:

uint64_t SSL_get_read_sequence(const SSL *ssl) {
  if (SSL_is_dtls(ssl)) {
    // TODO(crbug.com/42290608): This API should not be implemented for DTLS or
    // QUIC. In QUIC we do not maintain a sequence number.
    const DTLSReadEpoch *read_epoch = &ssl->d1->read_epoch;
    return DTLSRecordNumber(read_epoch->epoch, read_epoch->bitmap.max_seq_num())
        .combined();
  }
  return ssl->s3->read_sequence;
}